

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_stats.cpp
# Opt level: O0

void anon_unknown.dwarf_eff0::dump_index_stats<(pstore::trailer::indices)5>(database *db)

{
  bool bVar1;
  uint uVar2;
  element_type *peVar3;
  string *psVar4;
  ostream *poVar5;
  size_t sVar6;
  double dVar7;
  allocator local_81;
  string local_80 [48];
  undefined1 local_50 [8];
  stats s;
  shared_ptr<const_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  index;
  database *db_local;
  
  pstore::index::
  get_index<(pstore::trailer::indices)5,pstore::database_const,pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>const>
            ((index *)&s.max_depth_,db,false);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&s.max_depth_);
  if (bVar1) {
    stats::stats((stats *)local_50,db);
    peVar3 = std::
             __shared_ptr_access<const_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<const_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&s.max_depth_);
    (anonymous_namespace)::stats::
    traverse<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
              ((stats *)local_50,peVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"write",&local_81);
    psVar4 = pstore::utf::to_native_string((string *)local_80);
    poVar5 = std::operator<<((ostream *)&std::cout,(string *)psVar4);
    poVar5 = std::operator<<(poVar5,",");
    dVar7 = stats::branching_factor((stats *)local_50);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar7);
    poVar5 = std::operator<<(poVar5,",");
    dVar7 = stats::mean_leaf_depth((stats *)local_50);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar7);
    poVar5 = std::operator<<(poVar5,",");
    uVar2 = stats::max_depth((stats *)local_50);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar2);
    poVar5 = std::operator<<(poVar5,",");
    peVar3 = std::
             __shared_ptr_access<const_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&s.max_depth_);
    sVar6 = pstore::index::
            hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(peVar3);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar6);
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
  }
  std::
  shared_ptr<const_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~shared_ptr((shared_ptr<const_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&s.max_depth_);
  return;
}

Assistant:

void dump_index_stats (database const & db) {
        if (auto index = index::get_index<Index> (db, false /*create*/)) {
            stats s{db};
            s.traverse (*index);

            static constexpr auto newline = PSTORE_NATIVE_TEXT ("\n");
            static constexpr auto comma = PSTORE_NATIVE_TEXT (",");
            command_line::out_stream << utf::to_native_string (index_name<Index>::name) << comma
                                     << s.branching_factor () << comma << s.mean_leaf_depth ()
                                     << comma << s.max_depth () << comma << index->size ()
                                     << newline;
        }
    }